

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O1

uint __thiscall
ON_SubDComponentList::CreateFromComponentList
          (ON_SubDComponentList *this,ON_SubD *subd,
          ON_SimpleArray<ON_COMPONENT_INDEX> *component_list)

{
  uint vertex_id;
  element_type *peVar1;
  bool bVar2;
  uint uVar3;
  ON_SubDVertex *pOVar4;
  uint marked_component_count;
  ON_ComponentStatus *this_00;
  ulong uVar5;
  ON_SubDComponentMarksClearAndRestore saved_marks;
  ON_SubDComponentMarksClearAndRestore local_70;
  
  ON_SubDComponentMarksClearAndRestore::ON_SubDComponentMarksClearAndRestore(&local_70,subd);
  uVar3 = component_list->m_count;
  if ((ulong)uVar3 == 0) {
    marked_component_count = 0;
  }
  else {
    uVar5 = 0;
    marked_component_count = 0;
    do {
      if (component_list->m_a[uVar5].m_type == subd_vertex) {
        vertex_id = component_list->m_a[uVar5].m_index;
        if ((vertex_id + 1 < 2) ||
           (peVar1 = (subd->m_subdimple_sp).
                     super___shared_ptr<ON_SubDimple,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
           peVar1 == (element_type *)0x0)) {
          pOVar4 = (ON_SubDVertex *)0x0;
        }
        else {
          pOVar4 = ON_SubDHeap::VertexFromId(&peVar1->m_heap,vertex_id);
        }
        if (pOVar4 != (ON_SubDVertex *)0x0) {
          this_00 = &(pOVar4->super_ON_SubDComponentBase).m_status;
          bVar2 = ON_ComponentStatus::RuntimeMark(this_00);
          if (!bVar2) {
            ON_ComponentStatus::SetRuntimeMark(this_00);
            marked_component_count = marked_component_count + 1;
          }
        }
      }
      uVar5 = uVar5 + 1;
    } while (uVar3 != uVar5);
  }
  uVar3 = Internal_Create(this,subd,true,true,true,true,marked_component_count);
  ON_SubDComponentMarksClearAndRestore::~ON_SubDComponentMarksClearAndRestore(&local_70);
  return uVar3;
}

Assistant:

unsigned ON_SubDComponentList::CreateFromComponentList(const ON_SubD& subd, const ON_SimpleArray<ON_COMPONENT_INDEX>& component_list)
{
  ON_SubDComponentMarksClearAndRestore saved_marks(subd);
  const unsigned count = component_list.UnsignedCount();
  unsigned marked_count = 0;
  for (unsigned i = 0; i < count; ++i)
  {
    const ON_COMPONENT_INDEX ci = component_list[i];
    if (ON_COMPONENT_INDEX::TYPE::subd_vertex != ci.m_type)
      continue;
    const unsigned vertex_id = (unsigned)ci.m_index;
    const ON_SubDVertex* v = subd.VertexFromId(vertex_id);
    if (nullptr == v)
      continue;
    if (v->m_status.RuntimeMark())
      continue;
    v->m_status.SetRuntimeMark();
    ++marked_count;
  }
  return Internal_Create(subd, true, true, true, true, marked_count);
}